

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O0

SUNErrCode SUNAdaptController_SetParams_ImpGus(SUNAdaptController C,sunrealtype k1,sunrealtype k2)

{
  SUNContext_conflict sunctx_local_scope_;
  sunrealtype k2_local;
  sunrealtype k1_local;
  SUNAdaptController C_local;
  
  *(double *)C->content = k1 + k2;
  *(double *)((long)C->content + 8) = -k2;
  *(undefined8 *)((long)C->content + 0x10) = 0;
  *(undefined8 *)((long)C->content + 0x18) = 0x3ff0000000000000;
  *(undefined8 *)((long)C->content + 0x20) = 0;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_SetParams_ImpGus(SUNAdaptController C,
                                               sunrealtype k1, sunrealtype k2)
{
  SUNFunctionBegin(C->sunctx);
  SODERLIND_K1(C) = k1 + k2;
  SODERLIND_K2(C) = -k2;
  SODERLIND_K3(C) = SUN_RCONST(0.0);
  SODERLIND_K4(C) = SUN_RCONST(1.0);
  SODERLIND_K5(C) = SUN_RCONST(0.0);
  return SUN_SUCCESS;
}